

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O1

ValueBufferLayout *
vkt::anon_unknown_0::computeStd140Layout
          (ValueBufferLayout *__return_storage_ptr__,
          vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values)

{
  pointer pEVar1;
  int iVar2;
  int iVar3;
  Type dataType;
  int iVar4;
  pointer pVVar5;
  Entry EVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->entries).
           super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->entries).
           super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->entries).
  super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
  ::resize(&__return_storage_ptr__->entries,
           ((long)(values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
  pVVar5 = (values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
      super__Vector_impl_data._M_finish != pVVar5) {
    pEVar1 = (__return_storage_ptr__->entries).
             super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar8 = __return_storage_ptr__->size;
    lVar7 = 1;
    uVar10 = 0;
    do {
      dataType = (&(pVVar5->type).m_type)[lVar7 * 2];
      bVar11 = dataType - 5 < 9;
      bVar12 = dataType - 0x12 < 9;
      iVar2 = 1;
      if (bVar12 || bVar11) {
        iVar2 = glu::getDataTypeMatrixNumColumns(dataType);
        iVar3 = glu::getDataTypeMatrixNumRows(dataType);
        dataType = glu::getDataTypeFloatVec(iVar3);
      }
      iVar4 = glu::getDataTypeScalarSize(dataType);
      iVar3 = 0x10;
      if (iVar4 != 3) {
        iVar3 = iVar4 * 4;
      }
      if (bVar12 || bVar11) {
        iVar3 = 0x10;
      }
      uVar9 = -iVar3 & (iVar3 + iVar8) - 1U;
      EVar6.vecStride = iVar3;
      EVar6.offset = uVar9;
      pEVar1[uVar10] = EVar6;
      iVar8 = (iVar2 + -1) * iVar3 + iVar4 * 4 + uVar9;
      uVar10 = uVar10 + 1;
      pVVar5 = (values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 10;
    } while (uVar10 < (ulong)(((long)(values->
                                     super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4
                              ) * -0x3333333333333333));
    __return_storage_ptr__->size = iVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

ValueBufferLayout computeStd140Layout (const vector<Value>& values)
{
	ValueBufferLayout layout;

	layout.entries.resize(values.size());

	for (size_t ndx = 0; ndx < values.size(); ++ndx)
	{
		const DataType	basicType	= values[ndx].type.getBasicType();
		const bool		isMatrix	= isDataTypeMatrix(basicType);
		const int		numVecs		= isMatrix ? getDataTypeMatrixNumColumns(basicType) : 1;
		const DataType	vecType		= isMatrix ? glu::getDataTypeFloatVec(getDataTypeMatrixNumRows(basicType)) : basicType;
		const int		vecSize		= getDataTypeScalarSize(vecType);
		const int		alignment	= ((isMatrix || vecSize == 3) ? 4 : vecSize)*int(sizeof(deUint32));

		layout.size			= deAlign32(layout.size, alignment);
		layout.entries[ndx] = ValueBufferLayout::Entry(layout.size, alignment);
		layout.size			+= alignment*(numVecs-1) + vecSize*int(sizeof(deUint32));
	}

	return layout;
}